

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void __thiscall zmq::epoll_t::loop(epoll_t *this)

{
  int *piVar1;
  pointer pppVar2;
  int iVar3;
  uint uVar4;
  uint64_t uVar5;
  uint *puVar6;
  long lVar7;
  pointer pppVar8;
  epoll_event ev_buf [256];
  epoll_event local_c28 [192];
  
  do {
    while( true ) {
      uVar5 = poller_base_t::execute_timers((poller_base_t *)this);
      iVar3 = poller_base_t::get_load((poller_base_t *)this);
      uVar4 = (uint)uVar5;
      if (iVar3 == 0) break;
      uVar4 = epoll_wait(this->_epoll_fd,local_c28,0x100,-(uint)(uVar4 == 0) | uVar4);
      if (uVar4 == 0xffffffff) {
        puVar6 = (uint *)__errno_location();
        if (*puVar6 != 4) {
          loop((epoll_t *)(ulong)*puVar6);
        }
      }
      else {
        if (0 < (int)uVar4) {
          lVar7 = 0;
          do {
            piVar1 = *(int **)(&local_c28[0].field_0x4 + lVar7);
            if (*piVar1 != -1) {
              if ((*(byte *)((long)&local_c28[0].events + lVar7) & 0x18) != 0) {
                (**(code **)(**(long **)(piVar1 + 4) + 0x10))();
              }
              if (*piVar1 != -1) {
                if ((*(byte *)((long)&local_c28[0].events + lVar7) & 4) != 0) {
                  (**(code **)(**(long **)(piVar1 + 4) + 0x18))();
                }
                if ((*piVar1 != -1) && ((*(byte *)((long)&local_c28[0].events + lVar7) & 1) != 0)) {
                  (**(code **)(**(long **)(piVar1 + 4) + 0x10))();
                }
              }
            }
            lVar7 = lVar7 + 0xc;
          } while ((ulong)uVar4 * 0xc != lVar7);
        }
        pppVar2 = (this->_retired).
                  super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pppVar8 = (this->_retired).
                       super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; pppVar8 != pppVar2;
            pppVar8 = pppVar8 + 1) {
          if (*pppVar8 != (poll_entry_t *)0x0) {
            operator_delete(*pppVar8,0x18);
          }
          *pppVar8 = (poll_entry_t *)0x0;
        }
        pppVar8 = (this->_retired).
                  super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_retired).
            super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != pppVar8) {
          (this->_retired).
          super__Vector_base<zmq::epoll_t::poll_entry_t_*,_std::allocator<zmq::epoll_t::poll_entry_t_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = pppVar8;
        }
      }
    }
  } while (uVar4 != 0);
  return;
}

Assistant:

void zmq::epoll_t::loop ()
{
    epoll_event ev_buf[max_io_events];

    while (true) {
        //  Execute any due timers.
        const int timeout = static_cast<int> (execute_timers ());

        if (get_load () == 0) {
            if (timeout == 0)
                break;

            // TODO sleep for timeout
            continue;
        }

        //  Wait for events.
        const int n = epoll_wait (_epoll_fd, &ev_buf[0], max_io_events,
                                  timeout ? timeout : -1);
        if (n == -1) {
            errno_assert (errno == EINTR);
            continue;
        }

        for (int i = 0; i < n; i++) {
            const poll_entry_t *const pe =
              static_cast<const poll_entry_t *> (ev_buf[i].data.ptr);

            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & (EPOLLERR | EPOLLHUP))
                pe->events->in_event ();
            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & EPOLLOUT)
                pe->events->out_event ();
            if (pe->fd == retired_fd)
                continue;
            if (ev_buf[i].events & EPOLLIN)
                pe->events->in_event ();
        }

        //  Destroy retired event sources.
        for (retired_t::iterator it = _retired.begin (), end = _retired.end ();
             it != end; ++it) {
            LIBZMQ_DELETE (*it);
        }
        _retired.clear ();
    }
}